

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_flops.cc
# Opt level: O2

float __thiscall benchmark_9::run_kernel(benchmark_9 *this,size_t iterations)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined4 in_register_00000004;
  undefined4 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 in_ZMM3 [64];
  undefined1 auVar19 [64];
  undefined1 in_ZMM4 [64];
  undefined1 auVar20 [64];
  undefined1 in_ZMM5 [64];
  undefined1 auVar21 [64];
  undefined1 in_ZMM6 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar24 [64];
  undefined1 in_ZMM9 [64];
  undefined1 in_XMM11 [16];
  undefined1 auVar16 [64];
  
  uVar3 = rdtsc();
  uVar4 = rdtsc();
  auVar5 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,
                              uVar3 & 0xffffffff00000000 | CONCAT44(in_register_00000004,(int)uVar3)
                             );
  auVar15 = vcvtusi2ss_avx512f(in_ZMM1._0_16_,
                               uVar4 & 0xffffffff00000000 |
                               CONCAT44(in_register_00000004,(int)uVar4));
  uVar3 = rdtsc();
  uVar13 = auVar15._0_4_;
  auVar18 = ZEXT3264(CONCAT428(uVar13,CONCAT424(uVar13,CONCAT420(uVar13,CONCAT416(uVar13,CONCAT412(
                                                  uVar13,CONCAT48(uVar13,CONCAT44(uVar13,uVar13)))))
                                               )));
  uVar4 = rdtsc();
  auVar15 = vcvtusi2ss_avx512f(in_ZMM3._0_16_,
                               uVar3 & 0xffffffff00000000 |
                               CONCAT44(in_register_00000004,(int)uVar3));
  uVar13 = auVar15._0_4_;
  auVar17 = ZEXT3264(CONCAT428(uVar13,CONCAT424(uVar13,CONCAT420(uVar13,CONCAT416(uVar13,CONCAT412(
                                                  uVar13,CONCAT48(uVar13,CONCAT44(uVar13,uVar13)))))
                                               )));
  uVar3 = rdtsc();
  auVar15 = vcvtusi2ss_avx512f(in_ZMM4._0_16_,
                               uVar4 & 0xffffffff00000000 |
                               CONCAT44(in_register_00000004,(int)uVar4));
  uVar13 = auVar15._0_4_;
  auVar19 = ZEXT3264(CONCAT428(uVar13,CONCAT424(uVar13,CONCAT420(uVar13,CONCAT416(uVar13,CONCAT412(
                                                  uVar13,CONCAT48(uVar13,CONCAT44(uVar13,uVar13)))))
                                               )));
  auVar15 = vcvtusi2ss_avx512f(in_ZMM5._0_16_,
                               uVar3 & 0xffffffff00000000 |
                               CONCAT44(in_register_00000004,(int)uVar3));
  uVar3 = rdtsc();
  uVar13 = auVar5._0_4_;
  auVar16 = ZEXT3264(CONCAT428(uVar13,CONCAT424(uVar13,CONCAT420(uVar13,CONCAT416(uVar13,CONCAT412(
                                                  uVar13,CONCAT48(uVar13,CONCAT44(uVar13,uVar13)))))
                                               )));
  uVar13 = auVar15._0_4_;
  auVar20 = ZEXT3264(CONCAT428(uVar13,CONCAT424(uVar13,CONCAT420(uVar13,CONCAT416(uVar13,CONCAT412(
                                                  uVar13,CONCAT48(uVar13,CONCAT44(uVar13,uVar13)))))
                                               )));
  auVar5 = vcvtusi2ss_avx512f(in_ZMM6._0_16_,
                              uVar3 & 0xffffffff00000000 | CONCAT44(in_register_00000004,(int)uVar3)
                             );
  uVar3 = rdtsc();
  uVar13 = auVar5._0_4_;
  auVar23 = ZEXT3264(CONCAT428(uVar13,CONCAT424(uVar13,CONCAT420(uVar13,CONCAT416(uVar13,CONCAT412(
                                                  uVar13,CONCAT48(uVar13,CONCAT44(uVar13,uVar13)))))
                                               )));
  auVar5 = vcvtusi2ss_avx512f(in_ZMM8._0_16_,
                              uVar3 & 0xffffffff00000000 | CONCAT44(in_register_00000004,(int)uVar3)
                             );
  uVar3 = rdtsc();
  uVar13 = auVar5._0_4_;
  auVar21 = ZEXT3264(CONCAT428(uVar13,CONCAT424(uVar13,CONCAT420(uVar13,CONCAT416(uVar13,CONCAT412(
                                                  uVar13,CONCAT48(uVar13,CONCAT44(uVar13,uVar13)))))
                                               )));
  auVar5 = vcvtusi2ss_avx512f(in_ZMM9._0_16_,
                              uVar3 & 0xffffffff00000000 | CONCAT44(in_register_00000004,(int)uVar3)
                             );
  uVar3 = rdtsc();
  auVar1 = *(undefined1 (*) [32])(this->super_benchmark).mul1;
  uVar13 = auVar5._0_4_;
  auVar22 = ZEXT3264(CONCAT428(uVar13,CONCAT424(uVar13,CONCAT420(uVar13,CONCAT416(uVar13,CONCAT412(
                                                  uVar13,CONCAT48(uVar13,CONCAT44(uVar13,uVar13)))))
                                               )));
  auVar2 = *(undefined1 (*) [32])(this->super_benchmark).mul0;
  auVar5 = vcvtusi2ss_avx512f(in_XMM11,uVar3 & 0xffffffff00000000 |
                                       CONCAT44(in_register_00000004,(int)uVar3));
  uVar13 = auVar5._0_4_;
  auVar24 = ZEXT3264(CONCAT428(uVar13,CONCAT424(uVar13,CONCAT420(uVar13,CONCAT416(uVar13,CONCAT412(
                                                  uVar13,CONCAT48(uVar13,CONCAT44(uVar13,uVar13)))))
                                               )));
  do {
    auVar5 = vfmadd231ps_fma(auVar16._0_32_,auVar2,auVar1);
    auVar16 = ZEXT1664(auVar5);
    auVar15 = vfmadd231ps_fma(auVar18._0_32_,auVar2,auVar1);
    auVar18 = ZEXT1664(auVar15);
    auVar6 = vfmadd231ps_fma(auVar17._0_32_,auVar2,auVar1);
    auVar17 = ZEXT1664(auVar6);
    auVar7 = vfmadd231ps_fma(auVar19._0_32_,auVar2,auVar1);
    auVar19 = ZEXT1664(auVar7);
    auVar8 = vfmadd231ps_fma(auVar20._0_32_,auVar2,auVar1);
    auVar20 = ZEXT1664(auVar8);
    auVar9 = vfmadd231ps_fma(auVar23._0_32_,auVar2,auVar1);
    auVar23 = ZEXT1664(auVar9);
    auVar10 = vfmadd231ps_fma(auVar21._0_32_,auVar2,auVar1);
    auVar21 = ZEXT1664(auVar10);
    auVar11 = vfmadd231ps_fma(auVar22._0_32_,auVar2,auVar1);
    auVar22 = ZEXT1664(auVar11);
    auVar12 = vfmadd231ps_fma(auVar24._0_32_,auVar2,auVar1);
    auVar24 = ZEXT1664(auVar12);
    iterations = iterations - 1;
  } while (iterations != 0);
  auVar14._0_4_ =
       auVar6._0_4_ + auVar10._0_4_ + auVar7._0_4_ + auVar11._0_4_ +
       auVar12._0_4_ + auVar5._0_4_ + auVar8._0_4_ + auVar15._0_4_ + auVar9._0_4_ + 0.0;
  auVar14._4_4_ =
       auVar6._4_4_ + auVar10._4_4_ + auVar7._4_4_ + auVar11._4_4_ +
       auVar12._4_4_ + auVar5._4_4_ + auVar8._4_4_ + auVar15._4_4_ + auVar9._4_4_ + 0.0;
  auVar14._8_4_ =
       auVar6._8_4_ + auVar10._8_4_ + auVar7._8_4_ + auVar11._8_4_ +
       auVar12._8_4_ + auVar5._8_4_ + auVar8._8_4_ + auVar15._8_4_ + auVar9._8_4_ + 0.0;
  auVar14._12_4_ =
       auVar6._12_4_ + auVar10._12_4_ + auVar7._12_4_ + auVar11._12_4_ +
       auVar12._12_4_ + auVar5._12_4_ + auVar8._12_4_ + auVar15._12_4_ + auVar9._12_4_ + 0.0;
  auVar5 = vshufpd_avx(auVar14,auVar14,1);
  auVar15._0_4_ = auVar14._0_4_ + auVar5._0_4_;
  auVar15._4_4_ = auVar14._4_4_ + auVar5._4_4_;
  auVar15._8_4_ = auVar14._8_4_ + auVar5._8_4_;
  auVar15._12_4_ = auVar14._12_4_ + auVar5._12_4_;
  auVar5 = vhaddps_avx(auVar15,auVar15);
  return auVar5._0_4_;
}

Assistant:

float run_kernel(size_t iterations) const override
    {
            __m256 r0 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r1 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r2 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r3 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r4 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r5 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r6 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r7 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r8 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            do{
                r0 = _mm256_fmadd_ps(mul0, mul1, r0);
                r1 = _mm256_fmadd_ps(mul0, mul1, r1);
                r2 = _mm256_fmadd_ps(mul0, mul1, r2);
                r3 = _mm256_fmadd_ps(mul0, mul1, r3);
                r4 = _mm256_fmadd_ps(mul0, mul1, r4);
                r5 = _mm256_fmadd_ps(mul0, mul1, r5);
                r6 = _mm256_fmadd_ps(mul0, mul1, r6);
                r7 = _mm256_fmadd_ps(mul0, mul1, r7);
                r8 = _mm256_fmadd_ps(mul0, mul1, r8);

            }while (--iterations);

            r0 = _mm256_add_ps(r0, r4);
            r1 = _mm256_add_ps(r1, r5);
            r2 = _mm256_add_ps(r2, r6);
            r3 = _mm256_add_ps(r3, r7);

            r0 = _mm256_add_ps(r0, r1);
            r2 = _mm256_add_ps(r2, r3);
            
            r0 = _mm256_add_ps(r0, r8);
            r0 = _mm256_add_ps(r0, r2);
            return __m256_reduce_add_ps(r0);
    }